

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O3

int makesky(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  Allocator alloc;
  Point2i resolution_00;
  char *msg;
  long *plVar4;
  long lVar5;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  int resolution;
  Float elevation;
  Float turbidity;
  Float albedo;
  vector<float,_std::allocator<float>_> lambda;
  Vector3f sunDir;
  RGBColorSpace *colorSpace;
  ArHosekSkyModelState *skymodel_state;
  string outfile;
  Image img;
  int local_3c0;
  float local_3bc;
  char **local_3b8;
  float local_3b0;
  float local_3ac;
  string local_3a8;
  float local_384;
  undefined1 local_380 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_360;
  string local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  _Any_data local_2f8;
  code *local_2e8;
  code *local_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *local_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *local_2a0;
  _Any_data local_298;
  code *local_288;
  code *local_280;
  _Any_data local_278;
  code *pcStack_268;
  code *pcStack_260;
  SpectrumHandle local_258;
  ColorEncodingHandle local_250;
  undefined1 local_248 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  polymorphic_allocator<unsigned_char> local_190;
  uchar *local_188;
  size_t local_180;
  size_t local_178;
  polymorphic_allocator<pbrt::Half> local_170;
  Half *local_168;
  size_t local_160;
  size_t local_158;
  polymorphic_allocator<float> local_150;
  float *local_148;
  size_t local_140;
  size_t local_138;
  undefined1 local_130 [32];
  string local_110 [16];
  undefined1 local_100 [16];
  string local_f0 [8];
  bool local_e8;
  long local_e0 [7];
  bool local_a4;
  bool local_90;
  bool local_84;
  bool local_7c;
  bool local_74;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_70;
  bool local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_60;
  
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  local_338._M_string_length = 0;
  local_338.field_2._M_local_buf[0] = '\0';
  local_3ac = 0.5;
  local_3b0 = 3.0;
  local_3bc = 10.0;
  local_3c0 = 0x800;
  local_3b8 = argv;
  do {
    if (*local_3b8 == (char *)0x0) {
      if (local_338._M_string_length == 0) {
        msg = "--outfile must be specified";
      }
      else {
        msg = "--albedo must be between 0 and 1";
        if ((0.0 <= local_3ac) && (local_3ac <= 1.0)) {
          msg = "--turbidity must be between 1.7 and 10.";
          if ((local_3b0 <= 10.0) && (1.7 <= local_3b0)) {
            msg = "--elevation must be between 0. and 90.";
            if ((0.0 <= local_3bc) && (local_3bc <= 90.0)) {
              local_3bc = local_3bc * 0.017453292;
              if (0 < local_3c0) {
                local_384 = cosf(local_3bc);
                local_380._8_4_ = sinf(local_3bc);
                iVar1 = local_3c0;
                local_130._0_8_ = (long)local_130 + 0x10;
                local_380._0_8_ = (ulong)(uint)local_384 << 0x20;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"R","");
                local_110._0_8_ = local_100;
                std::__cxx11::string::_M_construct<char_const*>(local_110,"G","");
                plVar4 = local_e0;
                local_f0 = (string  [8])plVar4;
                std::__cxx11::string::_M_construct<char_const*>(local_f0,"B","");
                local_250.
                super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                         )0;
                alloc.memoryResource = pstd::pmr::new_delete_resource();
                resolution_00.super_Tuple2<pbrt::Point2,_int>.y = iVar1;
                resolution_00.super_Tuple2<pbrt::Point2,_int>.x = iVar1;
                channels.n = 3;
                channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_130;
                pbrt::Image::Image((Image *)local_248,Float,resolution_00,channels,&local_250,alloc)
                ;
                lVar5 = -0x60;
                do {
                  if (plVar4 != (long *)plVar4[-2]) {
                    operator_delete((long *)plVar4[-2],*plVar4 + 1);
                  }
                  plVar4 = plVar4 + -4;
                  lVar5 = lVar5 + 0x20;
                } while (lVar5 != 0);
                local_3a8.field_2._M_allocated_capacity = 0;
                local_3a8._M_dataplus._M_p = (pointer)0x0;
                local_3a8._M_string_length = 0;
                local_3a8._M_dataplus._M_p = (pointer)operator_new(0x34);
                local_3a8._M_string_length = (size_type)(local_3a8._M_dataplus._M_p + 0x34);
                local_3a8._M_dataplus._M_p[0x14] = '\0';
                local_3a8._M_dataplus._M_p[0x15] = '\0';
                local_3a8._M_dataplus._M_p[0x16] = '\0';
                local_3a8._M_dataplus._M_p[0x17] = '\0';
                local_3a8._M_dataplus._M_p[0x18] = '\0';
                local_3a8._M_dataplus._M_p[0x19] = '\0';
                local_3a8._M_dataplus._M_p[0x1a] = '\0';
                local_3a8._M_dataplus._M_p[0x1b] = '\0';
                local_3a8._M_dataplus._M_p[0x1c] = '\0';
                local_3a8._M_dataplus._M_p[0x1d] = '\0';
                local_3a8._M_dataplus._M_p[0x1e] = '\0';
                local_3a8._M_dataplus._M_p[0x1f] = '\0';
                local_3a8._M_dataplus._M_p[0x20] = '\0';
                local_3a8._M_dataplus._M_p[0x21] = '\0';
                local_3a8._M_dataplus._M_p[0x22] = '\0';
                local_3a8._M_dataplus._M_p[0x23] = '\0';
                local_3a8._M_dataplus._M_p[0x24] = '\0';
                local_3a8._M_dataplus._M_p[0x25] = '\0';
                local_3a8._M_dataplus._M_p[0x26] = '\0';
                local_3a8._M_dataplus._M_p[0x27] = '\0';
                local_3a8._M_dataplus._M_p[0x28] = '\0';
                local_3a8._M_dataplus._M_p[0x29] = '\0';
                local_3a8._M_dataplus._M_p[0x2a] = '\0';
                local_3a8._M_dataplus._M_p[0x2b] = '\0';
                local_3a8._M_dataplus._M_p[0x2c] = '\0';
                local_3a8._M_dataplus._M_p[0x2d] = '\0';
                local_3a8._M_dataplus._M_p[0x2e] = '\0';
                local_3a8._M_dataplus._M_p[0x2f] = '\0';
                local_3a8._M_dataplus._M_p[0x30] = '\0';
                local_3a8._M_dataplus._M_p[0x31] = '\0';
                local_3a8._M_dataplus._M_p[0x32] = '\0';
                local_3a8._M_dataplus._M_p[0x33] = '\0';
                local_3a8._M_dataplus._M_p[0] = '\0';
                local_3a8._M_dataplus._M_p[1] = '\0';
                local_3a8._M_dataplus._M_p[2] = '\0';
                local_3a8._M_dataplus._M_p[3] = '\0';
                local_3a8._M_dataplus._M_p[4] = '\0';
                local_3a8._M_dataplus._M_p[5] = '\0';
                local_3a8._M_dataplus._M_p[6] = '\0';
                local_3a8._M_dataplus._M_p[7] = '\0';
                local_3a8._M_dataplus._M_p[8] = '\0';
                local_3a8._M_dataplus._M_p[9] = '\0';
                local_3a8._M_dataplus._M_p[10] = '\0';
                local_3a8._M_dataplus._M_p[0xb] = '\0';
                local_3a8._M_dataplus._M_p[0xc] = '\0';
                local_3a8._M_dataplus._M_p[0xd] = '\0';
                local_3a8._M_dataplus._M_p[0xe] = '\0';
                local_3a8._M_dataplus._M_p[0xf] = '\0';
                local_3a8._M_dataplus._M_p[0x10] = '\0';
                local_3a8._M_dataplus._M_p[0x11] = '\0';
                local_3a8._M_dataplus._M_p[0x12] = '\0';
                local_3a8._M_dataplus._M_p[0x13] = '\0';
                local_3a8._M_dataplus._M_p[0x14] = '\0';
                local_3a8._M_dataplus._M_p[0x15] = '\0';
                local_3a8._M_dataplus._M_p[0x16] = '\0';
                local_3a8._M_dataplus._M_p[0x17] = '\0';
                local_3a8._M_dataplus._M_p[0x18] = '\0';
                local_3a8._M_dataplus._M_p[0x19] = '\0';
                local_3a8._M_dataplus._M_p[0x1a] = '\0';
                local_3a8._M_dataplus._M_p[0x1b] = '\0';
                local_3a8._M_dataplus._M_p[0x1c] = '\0';
                local_3a8._M_dataplus._M_p[0x1d] = '\0';
                local_3a8._M_dataplus._M_p[0x1e] = '\0';
                local_3a8._M_dataplus._M_p[0x1f] = '\0';
                local_3a8._M_dataplus._M_p[0] = '\0';
                local_3a8._M_dataplus._M_p[1] = '\0';
                local_3a8._M_dataplus._M_p[2] = -0x60;
                local_3a8._M_dataplus._M_p[3] = 'C';
                local_3a8._M_dataplus._M_p[4] = -0x55;
                local_3a8._M_dataplus._M_p[5] = -0x56;
                local_3a8._M_dataplus._M_p[6] = -0x50;
                local_3a8._M_dataplus._M_p[7] = 'C';
                local_3a8._M_dataplus._M_p[8] = 'U';
                local_3a8._M_dataplus._M_p[9] = 'U';
                local_3a8._M_dataplus._M_p[10] = -0x3f;
                local_3a8._M_dataplus._M_p[0xb] = 'C';
                local_3a8._M_dataplus._M_p[0xc] = '\0';
                local_3a8._M_dataplus._M_p[0xd] = '\0';
                local_3a8._M_dataplus._M_p[0xe] = -0x2e;
                local_3a8._M_dataplus._M_p[0xf] = 'C';
                local_3a8._M_dataplus._M_p[0x10] = -0x56;
                local_3a8._M_dataplus._M_p[0x11] = -0x56;
                local_3a8._M_dataplus._M_p[0x12] = -0x1e;
                local_3a8._M_dataplus._M_p[0x13] = 'C';
                local_3a8._M_dataplus._M_p[0x14] = 'V';
                local_3a8._M_dataplus._M_p[0x15] = 'U';
                local_3a8._M_dataplus._M_p[0x16] = -0xd;
                local_3a8._M_dataplus._M_p[0x17] = 'C';
                local_3a8._M_dataplus._M_p[0x18] = '\0';
                local_3a8._M_dataplus._M_p[0x19] = '\0';
                local_3a8._M_dataplus._M_p[0x1a] = '\x02';
                local_3a8._M_dataplus._M_p[0x1b] = 'D';
                local_3a8._M_dataplus._M_p[0x1c] = 'U';
                local_3a8._M_dataplus._M_p[0x1d] = 'U';
                local_3a8._M_dataplus._M_p[0x1e] = '\n';
                local_3a8._M_dataplus._M_p[0x1f] = 'D';
                local_3a8._M_dataplus._M_p[0x20] = -0x55;
                local_3a8._M_dataplus._M_p[0x21] = -0x56;
                local_3a8._M_dataplus._M_p[0x22] = '\x12';
                local_3a8._M_dataplus._M_p[0x23] = 'D';
                local_3a8._M_dataplus._M_p[0x24] = '\0';
                local_3a8._M_dataplus._M_p[0x25] = '\0';
                local_3a8._M_dataplus._M_p[0x26] = '\x1b';
                local_3a8._M_dataplus._M_p[0x27] = 'D';
                local_3a8._M_dataplus._M_p[0x28] = 'U';
                local_3a8._M_dataplus._M_p[0x29] = 'U';
                local_3a8._M_dataplus._M_p[0x2a] = '#';
                local_3a8._M_dataplus._M_p[0x2b] = 'D';
                local_3a8._M_dataplus._M_p[0x2c] = -0x55;
                local_3a8._M_dataplus._M_p[0x2d] = -0x56;
                local_3a8._M_dataplus._M_p[0x2e] = '+';
                local_3a8._M_dataplus._M_p[0x2f] = 'D';
                local_3a8._M_dataplus._M_p[0x30] = '\0';
                local_3a8._M_dataplus._M_p[0x31] = '\0';
                local_3a8._M_dataplus._M_p[0x32] = '4';
                local_3a8._M_dataplus._M_p[0x33] = 'D';
                *(undefined4 *)(local_3a8._M_dataplus._M_p + 0x34) =
                     *(undefined4 *)(local_3a8._M_dataplus._M_p + 0x34);
                *(undefined4 *)(local_3a8._M_dataplus._M_p + 0x38) =
                     *(undefined4 *)(local_3a8._M_dataplus._M_p + 0x38);
                *(undefined4 *)(local_3a8._M_dataplus._M_p + 0x3c) =
                     *(undefined4 *)(local_3a8._M_dataplus._M_p + 0x3c);
                local_3a8.field_2._M_allocated_capacity = local_3a8._M_string_length;
                local_358._M_dataplus._M_p =
                     (pointer)arhosekskymodelstate_alloc_init
                                        ((double)local_3bc,(double)local_3b0,(double)local_3ac);
                local_360 = pbrt::RGBColorSpace::ACES2065_1;
                local_258.
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                         )((long)pbrt::RGBColorSpace::ACES2065_1 + 0x20U | 0x2000000000000);
                pbrt::SpectrumToXYZ(&local_258);
                lVar5 = (long)local_3c0;
                local_278._M_unused._M_object = (void *)0x0;
                local_278._8_8_ = 0;
                pcStack_268 = (code *)0x0;
                pcStack_260 = (code *)0x0;
                local_278._M_unused._M_object = operator_new(0x30);
                *(string **)local_278._M_unused._0_8_ = &local_3a8;
                *(int **)((long)local_278._M_unused._0_8_ + 8) = &local_3c0;
                *(undefined1 **)((long)local_278._M_unused._0_8_ + 0x10) = local_380;
                *(string **)((long)local_278._M_unused._0_8_ + 0x18) = &local_358;
                *(aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                  **)((long)local_278._M_unused._0_8_ + 0x20) = &local_360;
                *(Image **)((long)local_278._M_unused._0_8_ + 0x28) = (Image *)local_248;
                pcStack_260 = std::
                              _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:279:32)>
                              ::_M_invoke;
                pcStack_268 = std::
                              _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:279:32)>
                              ::_M_manager;
                pbrt::ParallelFor(0,lVar5,(function<void_(long,_long)> *)&local_278);
                if (pcStack_268 != (code *)0x0) {
                  (*pcStack_268)(&local_278,&local_278,__destroy_functor);
                }
                local_60._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_60._M_impl.super__Rb_tree_header._M_header;
                local_130[4] = 0;
                local_e8 = false;
                local_a4 = false;
                local_90 = false;
                local_84 = false;
                local_7c = false;
                local_74 = false;
                local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_70 = local_360;
                local_68 = true;
                local_60._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_60._M_impl.super__Rb_tree_header._M_header._M_left;
                bVar2 = pbrt::Image::Write((Image *)local_248,&local_338,(ImageMetadata *)local_130)
                ;
                if (bVar2) {
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::~_Rb_tree(&local_60);
                  if (local_3a8._M_dataplus._M_p != (pointer)0x0) {
                    operator_delete(local_3a8._M_dataplus._M_p,
                                    local_3a8.field_2._M_allocated_capacity -
                                    (long)local_3a8._M_dataplus._M_p);
                  }
                  local_138 = 0;
                  (*(local_150.memoryResource)->_vptr_memory_resource[3])
                            (local_150.memoryResource,local_148,local_140 << 2,4);
                  local_158 = 0;
                  (*(local_170.memoryResource)->_vptr_memory_resource[3])
                            (local_170.memoryResource,local_168,local_160 * 2,2);
                  local_178 = 0;
                  (*(local_190.memoryResource)->_vptr_memory_resource[3])
                            (local_190.memoryResource,local_188,local_180,1);
                  pbrt::
                  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~InlinedVector(&local_238);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_338._M_dataplus._M_p != &local_338.field_2) {
                    operator_delete(local_338._M_dataplus._M_p,
                                    CONCAT71(local_338.field_2._M_allocated_capacity._1_7_,
                                             local_338.field_2._M_local_buf[0]) + 1);
                  }
                  return 0;
                }
                pbrt::LogFatal<char_const(&)[29]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                           ,0x13a,"Check failed: %s",(char (*) [29])"img.Write(outfile, metadata)");
              }
              msg = "--resolution must be >= 1";
            }
          }
        }
      }
      usage("makesky",msg);
    }
    local_248._0_8_ = &local_238;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"outfile","");
    local_298._M_unused._M_object = (void *)0x0;
    local_298._8_8_ = 0;
    local_280 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                ::_M_invoke;
    local_288 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                ::_M_manager;
    bVar2 = pbrt::ParseArg<std::__cxx11::string*>
                      (&local_3b8,(string *)local_248,&local_338,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_298);
    bVar3 = true;
    if (!bVar2) {
      local_130._0_8_ = (long)local_130 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"albedo","");
      local_2b8._M_unused._M_object = (void *)0x0;
      local_2b8._8_8_ = 0;
      local_2a0 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                  ::_M_invoke;
      local_2a8 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                  ::_M_manager;
      bVar2 = pbrt::ParseArg<float*>
                        (&local_3b8,(string *)local_130,&local_3ac,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_2b8);
      bVar3 = true;
      if (!bVar2) {
        local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"turbidity","");
        local_2d8._M_unused._M_object = (void *)0x0;
        local_2d8._8_8_ = 0;
        local_2c0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                    ::_M_invoke;
        local_2c8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                    ::_M_manager;
        bVar2 = pbrt::ParseArg<float*>
                          (&local_3b8,&local_3a8,&local_3b0,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_2d8);
        bVar3 = true;
        if (!bVar2) {
          local_380._0_8_ = &local_370;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_380,"elevation","");
          local_2f8._M_unused._M_object = (void *)0x0;
          local_2f8._8_8_ = 0;
          local_2e0 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                      ::_M_invoke;
          local_2e8 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                      ::_M_manager;
          bVar2 = pbrt::ParseArg<float*>
                            (&local_3b8,(string *)local_380,&local_3bc,
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_2f8);
          bVar3 = true;
          if (!bVar2) {
            local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"resolution","");
            local_318._M_unused._M_object = (void *)0x0;
            local_318._8_8_ = 0;
            local_300 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                        ::_M_invoke;
            local_308 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:234:24)>
                        ::_M_manager;
            bVar3 = pbrt::ParseArg<int*>
                              (&local_3b8,&local_358,&local_3c0,
                               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                *)&local_318);
            if (local_308 != (code *)0x0) {
              (*local_308)(&local_318,&local_318,__destroy_functor);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (local_2e8 != (code *)0x0) {
            (*local_2e8)(&local_2f8,&local_2f8,__destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_380._0_8_ != &local_370) {
            operator_delete((void *)local_380._0_8_,local_370._M_allocated_capacity + 1);
          }
        }
        if (local_2c8 != (code *)0x0) {
          (*local_2c8)(&local_2d8,&local_2d8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
          operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_2a8 != (code *)0x0) {
        (*local_2a8)(&local_2b8,&local_2b8,__destroy_functor);
      }
      if (local_130._0_8_ != (long)local_130 + 0x10) {
        operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
      }
    }
    if (local_288 != (code *)0x0) {
      (*local_288)(&local_298,&local_298,__destroy_functor);
    }
    if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_248._0_8_ != &local_238) {
      operator_delete((void *)local_248._0_8_,
                      CONCAT71(local_238.alloc.memoryResource._1_7_,
                               local_238.alloc.memoryResource._0_1_) + 1);
    }
  } while (bVar3 != false);
  local_248._0_8_ = &local_238;
  local_248._8_8_ = 0;
  local_238.alloc.memoryResource._0_1_ = '\0';
  pbrt::detail::stringPrintfRecursive<char*&>((string *)local_248,"argument %s invalid",local_3b8);
  usage("makesky","%s",local_248._0_8_);
}

Assistant:

int makesky(int argc, char *argv[]) {
    std::string outfile;
    Float albedo = 0.5;
    Float turbidity = 3.;
    Float elevation = 10;
    int resolution = 2048;

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("makesky", "%s", err.c_str());
            exit(1);
        };
        if (ParseArg(&argv, "outfile", &outfile, onError) ||
            ParseArg(&argv, "albedo", &albedo, onError) ||
            ParseArg(&argv, "turbidity", &turbidity, onError) ||
            ParseArg(&argv, "elevation", &elevation, onError) ||
            ParseArg(&argv, "resolution", &resolution, onError)) {
            // success
        } else
            onError(StringPrintf("argument %s invalid", *argv));
    }

    if (outfile.empty())
        usage("makesky", "--outfile must be specified");
    if (albedo < 0. || albedo > 1.)
        usage("makesky", "--albedo must be between 0 and 1");
    if (turbidity < 1.7 || turbidity > 10.)
        usage("makesky", "--turbidity must be between 1.7 and 10.");
    if (elevation < 0. || elevation > 90.)
        usage("makesky", "--elevation must be between 0. and 90.");
    elevation = Radians(elevation);
    if (resolution < 1)
        usage("makesky", "--resolution must be >= 1");

    // Vector pointing at the sun. Note that elevation is measured from the
    // horizon--not the zenith, as it is elsewhere in pbrt.
    Vector3f sunDir(0., std::cos(elevation), std::sin(elevation));

    Image img(PixelFormat::Float, {resolution, resolution}, {"R", "G", "B"});

    // They assert wavelengths are in this range...
    int nLambda = 1 + (720 - 320) / 32;
    std::vector<Float> lambda(nLambda, Float(0));
    for (int i = 0; i < nLambda; ++i)
        lambda[i] = Lerp(i / Float(nLambda - 1), 320, 720);

    // Assume a uniform spectral albedo
    ArHosekSkyModelState *skymodel_state =
        arhosekskymodelstate_alloc_init(elevation, turbidity, albedo);

    const RGBColorSpace *colorSpace = RGBColorSpace::ACES2065_1;
    XYZ illumXYZ = SpectrumToXYZ(&colorSpace->illuminant);

    ParallelFor(0, resolution, [&](int64_t start, int64_t end) {
        std::vector<Float> skyv(lambda.size());
        for (int64_t iy = start; iy < end; ++iy) {
            Float y = (iy + 0.5f) / resolution;
            for (int ix = 0; ix < resolution; ++ix) {
                Float x = (ix + 0.5f) / resolution;
                Vector3f v = EqualAreaSquareToSphere({x, y});
                if (v.z <= 0)
                    // downward hemisphere
                    continue;

                Float theta = SphericalTheta(v);

                // Compute the angle between the pixel's direction and the sun
                // direction.
                Float gamma = SafeACos(Dot(v, sunDir));
                DCHECK(gamma >= 0 && gamma <= Pi);

                for (int i = 0; i < lambda.size(); ++i)
                    skyv[i] = arhosekskymodel_solar_radiance(skymodel_state, theta, gamma,
                                                             lambda[i]);

                PiecewiseLinearSpectrum spec(pstd::MakeConstSpan(lambda),
                                             pstd::MakeConstSpan(skyv));
                XYZ xyz = SpectrumToXYZ(&spec);
                RGB rgb = colorSpace->ToRGB(xyz);

                for (int c = 0; c < 3; ++c)
                    img.SetChannel({ix, int(iy)}, c, rgb[c]);
            }
        }
    });

    ImageMetadata metadata;
    metadata.colorSpace = colorSpace;
    CHECK(img.Write(outfile, metadata));

    return 0;
}